

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O2

bool __thiscall Security::EncodeOpnd(Security *this,Instr *instr,Opnd *opnd)

{
  undefined1 *puVar1;
  int iVar2;
  Opnd *this_00;
  OpndKind OVar3;
  bool bVar4;
  int32 iVar5;
  IntConstOpnd *pIVar6;
  IntConstType IVar7;
  AddrOpnd *this_01;
  Var address;
  Opnd *newOpnd;
  RegOpnd *pRVar8;
  IndirOpnd *this_02;
  IndirOpnd *src;
  undefined1 local_60 [8];
  anon_class_24_3_ed9ba0f8 unlinkSrc;
  Opnd *opnd_local;
  Instr *local_38;
  Instr *instr_local;
  bool isSrc2;
  
  unlinkSrc.opnd = (Opnd **)&local_38;
  local_60 = (undefined1  [8])&unlinkSrc.isSrc2;
  unlinkSrc.instr = (Instr **)((long)&instr_local + 7);
  instr_local._7_1_ = 0;
  unlinkSrc.isSrc2 = (bool *)opnd;
  local_38 = instr;
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindIndir) {
    if (OVar3 == OpndKindAddr) {
      this_01 = IR::Opnd::AsAddrOpnd((Opnd *)unlinkSrc.isSrc2);
      EncodeOpnd::anon_class_24_3_ed9ba0f8::operator()((anon_class_24_3_ed9ba0f8 *)local_60);
      address = (Var)EncodeValue(this,local_38,&this_01->super_Opnd,(IntConstType)this_01->m_address
                                 ,(RegOpnd **)&opnd_local);
      IR::AddrOpnd::SetEncodedValue(this_01,address,this_01->addrOpndKind);
    }
    else {
      if (OVar3 != OpndKindIntConst) {
        return false;
      }
      pIVar6 = IR::Opnd::AsIntConstOpnd((Opnd *)unlinkSrc.isSrc2);
      EncodeOpnd::anon_class_24_3_ed9ba0f8::operator()((anon_class_24_3_ed9ba0f8 *)local_60);
      IVar7 = EncodeValue(this,local_38,&pIVar6->super_Opnd,
                          (pIVar6->super_EncodableOpnd<long>).m_value,(RegOpnd **)&opnd_local);
      (pIVar6->super_EncodableOpnd<long>).decodedValue = (pIVar6->super_EncodableOpnd<long>).m_value
      ;
      (pIVar6->super_EncodableOpnd<long>).m_value = IVar7;
    }
    this_00 = local_38->m_dst;
    newOpnd = opnd_local;
    if (this_00 != (Opnd *)0x0) {
      newOpnd = IR::Opnd::UseWithNewType(opnd_local,this_00->m_type,local_38->m_func);
      bVar4 = IR::Opnd::IsRegOpnd(this_00);
      if (bVar4) {
        pRVar8 = IR::Opnd::AsRegOpnd(this_00);
        if (pRVar8->m_sym != (StackSym *)0x0) {
          puVar1 = &pRVar8->m_sym->field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe47;
        }
      }
    }
    LowererMD::ImmedSrcToReg(local_38,newOpnd,instr_local._7_1_ + 1);
    return true;
  }
  this_02 = IR::Opnd::AsIndirOpnd((Opnd *)unlinkSrc.isSrc2);
  if (((this_02->m_baseOpnd == (RegOpnd *)0x0) || (this_02->m_indexOpnd != (RegOpnd *)0x0)) ||
     ((int)(short)this_02->m_offset != this_02->m_offset)) {
    pIVar6 = IR::IntConstOpnd::New((long)this_02->m_offset,TyInt64,local_38->m_func,false);
    IVar7 = EncodeValue(this,local_38,&pIVar6->super_Opnd,
                        (pIVar6->super_EncodableOpnd<long>).m_value,(RegOpnd **)&opnd_local);
    IR::IntConstOpnd::SetValue(pIVar6,IVar7);
    this_02->m_offset = 0;
    (this_02->super_Opnd).field_0xe = 0;
    if (this_02->m_indexOpnd == (RegOpnd *)0x0) {
      IR::IndirOpnd::SetIndexOpnd(this_02,(RegOpnd *)opnd_local);
      return true;
    }
    if (this_02->m_baseOpnd != (RegOpnd *)0x0) {
      pRVar8 = IR::RegOpnd::New(TyInt64,local_38->m_func);
      Lowerer::InsertAdd(false,&pRVar8->super_Opnd,opnd_local,&this_02->m_baseOpnd->super_Opnd,
                         local_38);
      IR::IndirOpnd::ReplaceBaseOpnd(this_02,pRVar8);
      return true;
    }
  }
  else {
    if ((this->baseOpnd == (RegOpnd *)0x0) ||
       (bVar4 = IR::Opnd::IsEqual(&this->baseOpnd->super_Opnd,&this_02->m_baseOpnd->super_Opnd),
       !bVar4)) {
      if (this->cookieOpnd != (IntConstOpnd *)0x0) {
        IR::Opnd::Free(&this->cookieOpnd->super_Opnd,this->func);
      }
      pIVar6 = BuildCookieOpnd(TyInt16,local_38->m_func);
      this->cookieOpnd = pIVar6;
      pRVar8 = IR::RegOpnd::New(TyInt64,local_38->m_func);
      this->basePlusCookieOpnd = pRVar8;
      pRVar8 = this_02->m_baseOpnd;
      this->baseOpnd = pRVar8;
      iVar5 = IR::IntConstOpnd::AsInt32(this->cookieOpnd);
      src = IR::IndirOpnd::New(pRVar8,iVar5,TyInt64,local_38->m_func,false);
      Lowerer::InsertLea(this->basePlusCookieOpnd,&src->super_Opnd,local_38);
    }
    iVar2 = this_02->m_offset;
    iVar5 = IR::IntConstOpnd::AsInt32(this->cookieOpnd);
    this_02->m_offset = iVar2 - iVar5;
    (this_02->super_Opnd).field_0xe = 0;
    opnd_local = &this->basePlusCookieOpnd->super_Opnd;
  }
  IR::IndirOpnd::SetBaseOpnd(this_02,(RegOpnd *)opnd_local);
  return true;
}

Assistant:

bool
Security::EncodeOpnd(IR::Instr * instr, IR::Opnd *opnd)
{
    IR::RegOpnd *newOpnd;
    bool isSrc2 = false;

    const auto unlinkSrc = [&]() {
        if (opnd != instr->GetSrc1())
        {
            Assert(opnd == instr->GetSrc2());
            isSrc2 = true;
            instr->UnlinkSrc2();
        }
        else
        {
            instr->UnlinkSrc1();
        }
    };

    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();

        unlinkSrc();

        intConstOpnd->SetEncodedValue(EncodeValue(instr, intConstOpnd, intConstOpnd->GetValue(), &newOpnd));
    }
    break;

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();

        unlinkSrc();

        addrOpnd->SetEncodedValue((Js::Var)this->EncodeValue(instr, addrOpnd, (IntConstType)addrOpnd->m_address, &newOpnd), addrOpnd->GetAddrOpndKind());
    }
    break;

    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();

        // Using 32 bit cookie causes major perf loss on the subsequent indirs, so only support this path for 16 bit offset
        // It's relatively rare for base to be null or to have index + offset, so fall back to the more generic xor method for these
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetIndexOpnd() == nullptr && Math::FitsInWord(indirOpnd->GetOffset()))
        {
            if (!this->baseOpnd || !this->baseOpnd->IsEqual(indirOpnd->GetBaseOpnd()))
            {
                if (this->cookieOpnd != nullptr)
                {
                    this->cookieOpnd->Free(this->func);
                }
                this->cookieOpnd = BuildCookieOpnd(TyInt16, instr->m_func);
                this->basePlusCookieOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
                this->baseOpnd = indirOpnd->GetBaseOpnd();
                IR::IndirOpnd * indir = IR::IndirOpnd::New(this->baseOpnd, this->cookieOpnd->AsInt32(), TyMachReg, instr->m_func);
                Lowerer::InsertLea(this->basePlusCookieOpnd, indir, instr);
            }
            int32 diff = indirOpnd->GetOffset() - this->cookieOpnd->AsInt32();
            indirOpnd->SetOffset((int32)diff);
            indirOpnd->SetBaseOpnd(this->basePlusCookieOpnd);
            return true;
        }

        IR::IntConstOpnd *indexOpnd = IR::IntConstOpnd::New(indirOpnd->GetOffset(), TyMachReg, instr->m_func);

        indexOpnd->SetValue(EncodeValue(instr, indexOpnd, indexOpnd->GetValue(), &newOpnd));

        indirOpnd->SetOffset(0);
        if (indirOpnd->GetIndexOpnd() != nullptr)
        {
            // update the base rather than the index, because index might have scale
            if (indirOpnd->GetBaseOpnd() != nullptr)
            {
                IR::RegOpnd * newBaseOpnd = IR::RegOpnd::New(TyMachReg, instr->m_func);
                Lowerer::InsertAdd(false, newBaseOpnd, newOpnd, indirOpnd->GetBaseOpnd(), instr);
                indirOpnd->ReplaceBaseOpnd(newBaseOpnd);
            }
            else
            {
                indirOpnd->SetBaseOpnd(newOpnd);
            }
        }
        else
        {
            indirOpnd->SetIndexOpnd(newOpnd);
        }
    }
    return true;

    default:
        return false;
    }

    IR::Opnd *dst = instr->GetDst();

    if (dst)
    {
#if TARGET_64
        // Ensure the left and right operand has the same type (that might not be true for constants on x64)
        newOpnd = (IR::RegOpnd *)newOpnd->UseWithNewType(dst->GetType(), instr->m_func);
#endif
        if (dst->IsRegOpnd())
        {
            IR::RegOpnd *dstRegOpnd = dst->AsRegOpnd();
            StackSym *dstSym = dstRegOpnd->m_sym;

            if (dstSym)
            {
                dstSym->m_isConst = false;
                dstSym->m_isIntConst = false;
                dstSym->m_isInt64Const = false;
                dstSym->m_isTaggableIntConst = false;
                dstSym->m_isFltConst = false;
            }
        }
    }

    LowererMD::ImmedSrcToReg(instr, newOpnd, isSrc2 ? 2 : 1);
    return true;
}